

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O1

date_t duckdb::Timestamp::GetDate(timestamp_t timestamp)

{
  long lVar1;
  
  if (timestamp.value == 0x7fffffffffffffff) {
    return (date_t)0x7fffffff;
  }
  if (timestamp.value != -0x7fffffffffffffff) {
    lVar1 = timestamp.value - (timestamp.value >> 0x3f);
    return (date_t)((((int)(lVar1 / 86400000000) + (int)(lVar1 >> 0x3f)) -
                    (SUB164(SEXT816(lVar1) * SEXT816(0x32e73fb956a1b897),0xc) >> 0x1f)) +
                   (int)(timestamp.value >> 0x3f));
  }
  return (date_t)-0x7fffffff;
}

Assistant:

date_t Timestamp::GetDate(timestamp_t timestamp) {
	if (DUCKDB_UNLIKELY(timestamp == timestamp_t::infinity())) {
		return date_t::infinity();
	}
	if (DUCKDB_UNLIKELY(timestamp == timestamp_t::ninfinity())) {
		return date_t::ninfinity();
	}
	return date_t(UnsafeNumericCast<int32_t>((timestamp.value + (timestamp.value < 0)) / Interval::MICROS_PER_DAY -
	                                         (timestamp.value < 0)));
}